

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O0

ktx_error_code_e ktxHashList_Sort(ktxHashList *pHead)

{
  bool bVar1;
  int iVar2;
  long *in_RDI;
  UT_hash_handle *_hs_tail;
  UT_hash_handle *_hs_list;
  UT_hash_handle *_hs_e;
  UT_hash_handle *_hs_q;
  UT_hash_handle *_hs_p;
  uint _hs_qsize;
  uint _hs_psize;
  uint _hs_insize;
  uint _hs_nmerges;
  uint _hs_looping;
  uint _hs_i;
  ktxKVListEntry *in_stack_ffffffffffffff68;
  ktxKVListEntry *in_stack_ffffffffffffff70;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  bool local_5a;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  uint local_28;
  int local_24;
  uint local_20;
  uint local_1c;
  uint local_14;
  ktx_error_code_e local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = KTX_INVALID_VALUE;
  }
  else {
    if (*in_RDI != 0) {
      local_20 = 1;
      bVar1 = true;
      local_48 = *in_RDI + 0x20;
      while (bVar1) {
        local_30 = local_48;
        local_48 = 0;
        local_50 = 0;
        local_1c = 0;
        while (local_30 != 0) {
          local_1c = local_1c + 1;
          local_38 = local_30;
          local_24 = 0;
          for (local_14 = 0; local_14 < local_20; local_14 = local_14 + 1) {
            local_24 = local_24 + 1;
            if (*(long *)(local_38 + 0x10) == 0) {
              local_58 = 0;
            }
            else {
              local_58 = *(long *)(local_38 + 0x10) + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
            }
            local_38 = local_58;
            if (local_58 == 0) break;
          }
          local_28 = local_20;
          while( true ) {
            local_5a = true;
            if (local_24 == 0) {
              local_5a = local_28 != 0 && local_38 != 0;
            }
            if (!local_5a) break;
            if (local_24 == 0) {
              local_40 = local_38;
              if (*(long *)(local_38 + 0x10) == 0) {
                local_68 = 0;
              }
              else {
                local_68 = *(long *)(local_38 + 0x10) + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
              }
              local_38 = local_68;
              local_28 = local_28 - 1;
            }
            else if ((local_28 == 0) || (local_38 == 0)) {
              local_40 = local_30;
              if (*(long *)(local_30 + 0x10) == 0) {
                local_70 = 0;
              }
              else {
                local_70 = *(long *)(local_30 + 0x10) + *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
              }
              local_30 = local_70;
              local_24 = local_24 + -1;
            }
            else {
              iVar2 = sort_by_key_codepoint(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
              if (iVar2 < 1) {
                local_40 = local_30;
                if (*(long *)(local_30 + 0x10) == 0) {
                  local_78 = 0;
                }
                else {
                  local_78 = *(long *)(local_30 + 0x10) +
                             *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
                }
                local_30 = local_78;
                local_24 = local_24 + -1;
              }
              else {
                local_40 = local_38;
                if (*(long *)(local_38 + 0x10) == 0) {
                  local_80 = 0;
                }
                else {
                  local_80 = *(long *)(local_38 + 0x10) +
                             *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
                }
                local_38 = local_80;
                local_28 = local_28 - 1;
              }
            }
            if (local_50 == 0) {
              local_48 = local_40;
            }
            else {
              if (local_40 == 0) {
                local_88 = 0;
              }
              else {
                local_88 = local_40 - *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
              }
              *(long *)(local_50 + 0x10) = local_88;
            }
            if (local_50 == 0) {
              in_stack_ffffffffffffff70 = (ktxKVListEntry *)0x0;
            }
            else {
              in_stack_ffffffffffffff70 =
                   (ktxKVListEntry *)(local_50 - *(long *)(*(long *)(*in_RDI + 0x20) + 0x20));
            }
            *(ktxKVListEntry **)(local_40 + 8) = in_stack_ffffffffffffff70;
            local_50 = local_40;
          }
          local_30 = local_38;
        }
        *(undefined8 *)(local_50 + 0x10) = 0;
        if (local_1c < 2) {
          bVar1 = false;
          *(long *)(*(long *)(*in_RDI + 0x20) + 0x18) = local_50;
          *in_RDI = local_48 - *(long *)(*(long *)(*in_RDI + 0x20) + 0x20);
        }
        local_20 = local_20 << 1;
      }
    }
    local_4 = KTX_SUCCESS;
  }
  return local_4;
}

Assistant:

KTX_error_code
ktxHashList_Sort(ktxHashList* pHead)
{
    if (pHead) {
        //ktxKVListEntry* kv = (ktxKVListEntry*)pHead;

        HASH_SORT(*pHead, sort_by_key_codepoint);
        return KTX_SUCCESS;
    } else {
        return KTX_INVALID_VALUE;
    }
}